

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O0

void __thiscall Matrix_Init_Test::~Matrix_Init_Test(Matrix_Init_Test *this)

{
  Matrix_Init_Test *this_local;
  
  ~Matrix_Init_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Matrix, Init) {
  Matrix<int> m(2, 2);
  m[0][0] = 1;
  m[0][1] = 2;
  m[1][0] = 3;
  m[1][1] = 4;
  EXPECT_EQ(m[0][0], 1);
  EXPECT_EQ(m[0][1], 2);
  EXPECT_EQ(m[1][0], 3);
  EXPECT_EQ(m[1][1], 4);
}